

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
test<char>(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,string *inifile,Ini<char> *ini)

{
  ostream *poVar1;
  ostringstream local_198 [8];
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> os;
  Ini<char> *ini_local;
  string *inifile_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  parse<char>(inifile,ini);
  poVar1 = std::operator<<((ostream *)local_198,">>> ERRORS <<<");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  errors<char>((basic_ostream<char,_std::char_traits<char>_> *)local_198,ini);
  poVar1 = std::operator<<((ostream *)local_198,">>> GENERATE <<<");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  inipp::Ini<char>::generate(ini,(basic_ostream<char,_std::char_traits<char>_> *)local_198);
  poVar1 = std::operator<<((ostream *)local_198,">>> INTERPOLATE <<<");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  inipp::Ini<char>::interpolate(ini);
  inipp::Ini<char>::generate(ini,(basic_ostream<char,_std::char_traits<char>_> *)local_198);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

static inline std::basic_string<CharT> test(const std::string & inifile, Ini<CharT> & ini) {
	std::basic_ostringstream<CharT> os;
	parse(inifile, ini);
	os << ">>> ERRORS <<<" << std::endl;
	errors(os, ini);
	os << ">>> GENERATE <<<" << std::endl;
	ini.generate(os);
	os << ">>> INTERPOLATE <<<" << std::endl;
	ini.interpolate();
	ini.generate(os);
	return os.str();
}